

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogDestination(LogSeverity severity,char *base_filename)

{
  LogFileObject *in_RSI;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffc8;
  MutexLock *in_stack_ffffffffffffffd0;
  LogSeverity in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  
  ::glog_internal_namespace_::MutexLock::MutexLock
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  log_destination(in_stack_ffffffffffffffe4);
  anon_unknown_10::LogFileObject::SetBasename(in_RSI,in_stack_ffffffffffffffe8);
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)0x12b989);
  return;
}

Assistant:

inline void LogDestination::SetLogDestination(LogSeverity severity,
					      const char* base_filename) {
  assert(severity >= 0 && severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetBasename(base_filename);
}